

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O2

void fekete_subrule_3(int suborder_num,double *suborder_xyz,double *suborder_w)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)suborder_num;
  if (suborder_num < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 * 0x18 - uVar2 != 0; uVar2 = uVar2 + 0x18) {
    uVar1 = *(undefined8 *)((long)fekete_subrule_3::suborder_xy_rule_3 + uVar2 + 8);
    *(undefined8 *)((long)suborder_xyz + uVar2) =
         *(undefined8 *)((long)fekete_subrule_3::suborder_xy_rule_3 + uVar2);
    ((undefined8 *)((long)suborder_xyz + uVar2))[1] = uVar1;
    *(undefined8 *)((long)suborder_xyz + uVar2 + 0x10) =
         *(undefined8 *)((long)fekete_subrule_3::suborder_xy_rule_3 + uVar2 + 0x10);
  }
  for (lVar3 = 0; uVar4 * 8 != lVar3; lVar3 = lVar3 + 8) {
    *(undefined8 *)((long)suborder_w + lVar3) =
         *(undefined8 *)((long)fekete_subrule_3::suborder_w_rule_3 + lVar3);
  }
  return;
}

Assistant:

void fekete_subrule_3 ( int suborder_num, double suborder_xyz[], 
  double suborder_w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_SUBRULE_3 returns a compressed Fekete rule 3.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 December 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int SUBORDER_NUM, the number of suborders of the rule.
//
//    Output, double SUBORDER_XYZ[3*SUBORDER_NUM],
//    the barycentric coordinates of the abscissas.
//
//    Output, double SUBORDER_W[SUBORDER_NUM], the suborder weights.
//
{
  int s;
  static double suborder_xy_rule_3[3*12] = {
      0.3333333333,  0.3333333333, 0.3333333334, 
      0.1704318201,  0.1704318201, 0.6591363598, 
      0.0600824712,  0.4699587644, 0.4699587644, 
      0.0489345696,  0.0489345696, 0.9021308608, 
      0.0000000000,  0.0000000000, 1.0000000000, 
      0.1784337588,  0.3252434900, 0.4963227512, 
      0.0588564879,  0.3010242110, 0.6401193011, 
      0.0551758079,  0.1543901944, 0.7904339977, 
      0.0000000000,  0.4173602935, 0.5826397065, 
      0.0000000000,  0.2610371960, 0.7389628040, 
      0.0000000000,  0.1306129092, 0.8693870908, 
      0.0000000000,  0.0402330070, 0.9597669930 };
  static double suborder_w_rule_3[12] = {
      0.1096011288, 
      0.0767491008, 
      0.0646677819, 
      0.0276211659, 
      0.0013925011, 
      0.0933486453, 
      0.0619010169, 
      0.0437466450, 
      0.0114553907, 
      0.0093115568, 
      0.0078421987, 
      0.0022457501 };

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_xyz[0+s*3] = suborder_xy_rule_3[0+s*3];
    suborder_xyz[1+s*3] = suborder_xy_rule_3[1+s*3];
    suborder_xyz[2+s*3] = suborder_xy_rule_3[2+s*3];
  }

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_w[s] = suborder_w_rule_3[s];
  }

  return;
}